

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256.c
# Opt level: O1

void exp_vartime_precomp(uint64_t *n,uint64_t mu,uint64_t *r2,uint64_t *a,uint32_t bBits,uint64_t *b
                        ,uint64_t *res)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  sbyte sVar4;
  uint uVar5;
  uint64_t *c_00;
  uint64_t *__src;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  uint64_t aM [64];
  uint64_t c_2 [128];
  uint64_t c [128];
  uint64_t resM [64];
  uint64_t aM_1 [64];
  uint64_t tmp0 [64];
  uint64_t tmp [64];
  uint64_t table [1024];
  uint64_t local_3838 [64];
  uint64_t local_3638 [64];
  undefined1 auStack_3438 [512];
  uint64_t local_3238 [64];
  undefined1 local_3038 [1536];
  uint64_t local_2a38 [64];
  uint64_t local_2838 [64];
  undefined1 auStack_2638 [512];
  uint64_t local_2438 [64];
  uint64_t local_2238 [64];
  uint64_t local_2038 [64];
  uint64_t local_1e38 [64];
  uint64_t local_1c38 [64];
  uint64_t local_1a38 [64];
  uint64_t local_1838 [64];
  uint64_t local_1638 [64];
  uint64_t local_1438 [64];
  uint64_t local_1238 [64];
  uint64_t local_1038 [64];
  undefined1 local_e38 [512];
  uint64_t local_c38 [64];
  undefined1 local_a38 [512];
  uint64_t local_838 [64];
  undefined1 local_638 [512];
  uint64_t local_438 [64];
  undefined1 local_238 [520];
  
  if (bBits < 200) {
    uVar7 = 0;
    memset(local_2838,0,0x200);
    memset(local_3238,0,0x400);
    memset(local_2038,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64(0x40,a,r2,local_2038,local_3238);
    reduction(n,mu,local_3238,local_2838);
    memset(local_3838,0,0x200);
    memcpy(local_3638,n,0x200);
    memcpy(auStack_3438,r2,0x200);
    memset(local_1e38,0,0x200);
    memcpy(local_2038,r2,0x200);
    reduction(local_3638,mu,local_2038,local_3838);
    if (bBits != 0) {
      do {
        if ((b[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0) {
          memset(local_3238,0,0x400);
          memset(local_2038,0,0x800);
          Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64
                    (0x40,local_3838,local_2838,local_2038,local_3238);
          areduction(local_3638,mu,local_3238,local_3838);
        }
        memset(local_3238,0,0x400);
        memset(local_2038,0,0x800);
        Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_2838,local_2038,local_3238);
        areduction(local_3638,mu,local_3238,local_2838);
        uVar6 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar6;
      } while (bBits != uVar6);
    }
    memset(local_1e38,0,0x200);
    c_00 = local_2038;
    __src = local_3838;
  }
  else {
    memset(local_3838,0,0x200);
    memset(local_3238,0,0x400);
    memset(local_2038,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64(0x40,a,r2,local_2038,local_3238);
    reduction(n,mu,local_3238,local_3838);
    memset(local_2a38,0,0x200);
    uVar6 = bBits - 1 >> 6;
    memcpy(local_2838,n,0x200);
    memcpy(auStack_2638,r2,0x200);
    memset(local_2038,0,0x2000);
    memset(local_2238,0,0x200);
    memset(local_3038,0,0x200);
    memcpy(local_3238,r2,0x200);
    reduction(local_2838,mu,local_3238,local_2038);
    memcpy(local_1e38,local_3838,0x200);
    memset(local_3638,0,0x400);
    memset(local_3238,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_1e38,local_3238,local_3638);
    areduction(local_2838,mu,local_3638,local_2238);
    memcpy(local_1c38,local_2238,0x200);
    memset(local_3638,0,0x400);
    memset(local_3238,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64(0x40,local_3838,local_1c38,local_3238,local_3638);
    areduction(local_2838,mu,local_3638,local_2238);
    memcpy(local_1a38,local_2238,0x200);
    memset(local_3638,0,0x400);
    memset(local_3238,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_1c38,local_3238,local_3638);
    areduction(local_2838,mu,local_3638,local_2238);
    memcpy(local_1838,local_2238,0x200);
    memset(local_3638,0,0x400);
    memset(local_3238,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64(0x40,local_3838,local_1838,local_3238,local_3638);
    areduction(local_2838,mu,local_3638,local_2238);
    memcpy(local_1638,local_2238,0x200);
    memset(local_3638,0,0x400);
    memset(local_3238,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_1a38,local_3238,local_3638);
    areduction(local_2838,mu,local_3638,local_2238);
    memcpy(local_1438,local_2238,0x200);
    memset(local_3638,0,0x400);
    memset(local_3238,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64(0x40,local_3838,local_1438,local_3238,local_3638);
    areduction(local_2838,mu,local_3638,local_2238);
    memcpy(local_1238,local_2238,0x200);
    memset(local_3638,0,0x400);
    memset(local_3238,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_1838,local_3238,local_3638);
    areduction(local_2838,mu,local_3638,local_2238);
    memcpy(local_1038,local_2238,0x200);
    memset(local_3638,0,0x400);
    memset(local_3238,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64(0x40,local_3838,local_1038,local_3238,local_3638);
    areduction(local_2838,mu,local_3638,local_2238);
    memcpy(local_e38,local_2238,0x200);
    memset(local_3638,0,0x400);
    memset(local_3238,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_1638,local_3238,local_3638);
    areduction(local_2838,mu,local_3638,local_2238);
    memcpy(local_c38,local_2238,0x200);
    memset(local_3638,0,0x400);
    memset(local_3238,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64(0x40,local_3838,local_c38,local_3238,local_3638);
    areduction(local_2838,mu,local_3638,local_2238);
    memcpy(local_a38,local_2238,0x200);
    memset(local_3638,0,0x400);
    memset(local_3238,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_1438,local_3238,local_3638);
    areduction(local_2838,mu,local_3638,local_2238);
    memcpy(local_838,local_2238,0x200);
    memset(local_3638,0,0x400);
    memset(local_3238,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64(0x40,local_3838,local_838,local_3238,local_3638);
    areduction(local_2838,mu,local_3638,local_2238);
    memcpy(local_638,local_2238,0x200);
    memset(local_3638,0,0x400);
    memset(local_3238,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_1238,local_3238,local_3638);
    areduction(local_2838,mu,local_3638,local_2238);
    memcpy(local_438,local_2238,0x200);
    memset(local_3638,0,0x400);
    memset(local_3238,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64(0x40,local_3838,local_438,local_3238,local_3638);
    areduction(local_2838,mu,local_3638,local_2238);
    memcpy(local_238,local_2238,0x200);
    if ((bBits & 3) == 0) {
      memset(local_3038,0,0x200);
      memcpy(local_3238,auStack_2638,0x200);
      reduction(local_2838,mu,local_3238,local_2a38);
    }
    else {
      uVar5 = bBits >> 6;
      bVar3 = (byte)bBits & 0x3c;
      uVar1 = (uint)(b[uVar5] >> bVar3);
      if ((bBits & 0x3c) != 0 && uVar5 < uVar6) {
        uVar1 = uVar1 | (uint)(b[(ulong)uVar5 + 1] << (-bVar3 & 0x3f));
      }
      memcpy(local_2a38,(void *)((long)local_2038 + (ulong)((uVar1 & 0xf) << 9)),0x200);
    }
    memset(local_2438,0,0x200);
    uVar5 = bBits & 0xfffffffc;
    iVar8 = (bBits >> 2) + (uint)(bBits == 0);
    do {
      uVar5 = uVar5 - 4;
      memset(local_3638,0,0x400);
      memset(local_3238,0,0x800);
      Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_2a38,local_3238,local_3638);
      areduction(local_2838,mu,local_3638,local_2a38);
      memset(local_3638,0,0x400);
      memset(local_3238,0,0x800);
      Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_2a38,local_3238,local_3638);
      areduction(local_2838,mu,local_3638,local_2a38);
      memset(local_3638,0,0x400);
      memset(local_3238,0,0x800);
      Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_2a38,local_3238,local_3638);
      areduction(local_2838,mu,local_3638,local_2a38);
      memset(local_3638,0,0x400);
      memset(local_3238,0,0x800);
      Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_2a38,local_3238,local_3638);
      areduction(local_2838,mu,local_3638,local_2a38);
      uVar1 = uVar5 >> 6;
      sVar4 = (sbyte)(uVar5 & 0x3c);
      uVar2 = (uint)(b[uVar1] >> sVar4);
      if ((uVar5 & 0x3c) != 0 && uVar1 < uVar6) {
        uVar2 = uVar2 | (uint)(b[(ulong)uVar1 + 1] << (-sVar4 & 0x3fU));
      }
      memcpy(local_2438,(void *)((long)local_2038 + (ulong)((uVar2 & 0xf) << 9)),0x200);
      memset(local_3638,0,0x400);
      memset(local_3238,0,0x800);
      Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64
                (0x40,local_2a38,local_2438,local_3238,local_3638);
      areduction(local_2838,mu,local_3638,local_2a38);
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
    memset(local_3038,0,0x200);
    c_00 = local_3238;
    __src = local_2a38;
  }
  memcpy(c_00,__src,0x200);
  reduction(n,mu,c_00,res);
  return;
}

Assistant:

static inline void
exp_vartime_precomp(
  uint64_t *n,
  uint64_t mu,
  uint64_t *r2,
  uint64_t *a,
  uint32_t bBits,
  uint64_t *b,
  uint64_t *res
)
{
  if (bBits < 200U)
  {
    uint64_t aM[4U] = { 0U };
    to(n, mu, r2, a, aM);
    uint64_t resM[4U] = { 0U };
    uint64_t ctx[8U] = { 0U };
    memcpy(ctx, n, 4U * sizeof (uint64_t));
    memcpy(ctx + 4U, r2, 4U * sizeof (uint64_t));
    uint64_t *ctx_n = ctx;
    uint64_t *ctx_r2 = ctx + 4U;
    from(ctx_n, mu, ctx_r2, resM);
    for (uint32_t i = 0U; i < bBits; i++)
    {
      uint32_t i1 = i / 64U;
      uint32_t j = i % 64U;
      uint64_t tmp = b[i1];
      uint64_t bit = tmp >> j & 1ULL;
      if (!(bit == 0ULL))
      {
        uint64_t *ctx_n0 = ctx;
        amont_mul(ctx_n0, mu, resM, aM, resM);
      }
      uint64_t *ctx_n0 = ctx;
      amont_sqr(ctx_n0, mu, aM, aM);
    }
    from(n, mu, resM, res);
    return;
  }
  uint64_t aM[4U] = { 0U };
  to(n, mu, r2, a, aM);
  uint64_t resM[4U] = { 0U };
  uint32_t bLen;
  if (bBits == 0U)
  {
    bLen = 1U;
  }
  else
  {
    bLen = (bBits - 1U) / 64U + 1U;
  }
  uint64_t ctx[8U] = { 0U };
  memcpy(ctx, n, 4U * sizeof (uint64_t));
  memcpy(ctx + 4U, r2, 4U * sizeof (uint64_t));
  uint64_t table[64U] = { 0U };
  uint64_t tmp[4U] = { 0U };
  uint64_t *t0 = table;
  uint64_t *t1 = table + 4U;
  uint64_t *ctx_n0 = ctx;
  uint64_t *ctx_r20 = ctx + 4U;
  from(ctx_n0, mu, ctx_r20, t0);
  memcpy(t1, aM, 4U * sizeof (uint64_t));
  KRML_MAYBE_FOR7(i,
    0U,
    7U,
    1U,
    uint64_t *t11 = table + (i + 1U) * 4U;
    uint64_t *ctx_n1 = ctx;
    amont_sqr(ctx_n1, mu, t11, tmp);
    memcpy(table + (2U * i + 2U) * 4U, tmp, 4U * sizeof (uint64_t));
    uint64_t *t2 = table + (2U * i + 2U) * 4U;
    uint64_t *ctx_n = ctx;
    amont_mul(ctx_n, mu, aM, t2, tmp);
    memcpy(table + (2U * i + 3U) * 4U, tmp, 4U * sizeof (uint64_t)););
  if (bBits % 4U != 0U)
  {
    uint32_t i = bBits / 4U * 4U;
    uint64_t bits_c = Hacl_Bignum_Lib_bn_get_bits_u64(bLen, b, i, 4U);
    uint32_t bits_l32 = (uint32_t)bits_c;
    const uint64_t *a_bits_l = table + bits_l32 * 4U;
    memcpy(resM, (uint64_t *)a_bits_l, 4U * sizeof (uint64_t));
  }
  else
  {
    uint64_t *ctx_n = ctx;
    uint64_t *ctx_r2 = ctx + 4U;
    from(ctx_n, mu, ctx_r2, resM);
  }
  uint64_t tmp0[4U] = { 0U };
  for (uint32_t i = 0U; i < bBits / 4U; i++)
  {
    KRML_MAYBE_FOR4(i0,
      0U,
      4U,
      1U,
      uint64_t *ctx_n = ctx;
      amont_sqr(ctx_n, mu, resM, resM););
    uint32_t k = bBits - bBits % 4U - 4U * i - 4U;
    uint64_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u64(bLen, b, k, 4U);
    uint32_t bits_l32 = (uint32_t)bits_l;
    const uint64_t *a_bits_l = table + bits_l32 * 4U;
    memcpy(tmp0, (uint64_t *)a_bits_l, 4U * sizeof (uint64_t));
    uint64_t *ctx_n = ctx;
    amont_mul(ctx_n, mu, resM, tmp0, resM);
  }
  from(n, mu, resM, res);
}